

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_STATUS HPDF_Doc_SetEncryptOn(HPDF_Doc pdf)

{
  HPDF_STATUS HVar1;
  HPDF_Doc pdf_local;
  
  if (pdf->encrypt_on == 0) {
    if (pdf->encrypt_dict == (HPDF_EncryptDict)0x0) {
      pdf_local = (HPDF_Doc)HPDF_SetError(&pdf->error,0x100b,0);
    }
    else if (((pdf->encrypt_dict->header).obj_id == 0) &&
            (HVar1 = HPDF_Xref_Add(pdf->xref,pdf->encrypt_dict), HVar1 != 0)) {
      pdf_local = (HPDF_Doc)(pdf->error).error_no;
    }
    else {
      HVar1 = HPDF_Dict_Add(pdf->trailer,"Encrypt",pdf->encrypt_dict);
      if (HVar1 == 0) {
        pdf->encrypt_on = 1;
        pdf_local = (HPDF_Doc)0x0;
      }
      else {
        pdf_local = (HPDF_Doc)(pdf->error).error_no;
      }
    }
  }
  else {
    pdf_local = (HPDF_Doc)0x0;
  }
  return (HPDF_STATUS)pdf_local;
}

Assistant:

HPDF_STATUS
HPDF_Doc_SetEncryptOn  (HPDF_Doc   pdf)
{
    HPDF_PTRACE ((" HPDF_Doc_SetEncryptOn\n"));

    if (pdf->encrypt_on)
        return HPDF_OK;

    if (!pdf->encrypt_dict)
        return HPDF_SetError (&pdf->error, HPDF_DOC_ENCRYPTDICT_NOT_FOUND,
                0);

    if (pdf->encrypt_dict->header.obj_id == HPDF_OTYPE_NONE)
        if (HPDF_Xref_Add (pdf->xref, pdf->encrypt_dict) != HPDF_OK)
            return pdf->error.error_no;

    if (HPDF_Dict_Add (pdf->trailer, "Encrypt", pdf->encrypt_dict) != HPDF_OK)
        return pdf->error.error_no;

    pdf->encrypt_on = HPDF_TRUE;

    return HPDF_OK;
}